

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_lpCall(HighsInt num_col,HighsInt num_row,HighsInt num_nz,HighsInt a_format,
                     HighsInt sense,double offset,double *col_cost,double *col_lower,
                     double *col_upper,double *row_lower,double *row_upper,HighsInt *a_start,
                     HighsInt *a_index,double *a_value,double *col_value,double *col_dual,
                     double *row_value,double *row_dual,HighsInt *col_basis_status,
                     HighsInt *row_basis_status,HighsInt *model_status)

{
  HighsStatus HVar1;
  HighsSolution *pHVar2;
  HighsBasis *pHVar3;
  HighsModelStatus *pHVar4;
  HighsInfo *pHVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  int in_ESI;
  int in_EDI;
  Highs *in_stack_00000008;
  Highs *in_stack_00000010;
  long in_stack_00000040;
  long in_stack_00000048;
  long in_stack_00000050;
  long in_stack_00000058;
  long in_stack_00000060;
  long in_stack_00000068;
  HighsModelStatus *in_stack_00000070;
  HighsInt i_1;
  bool copy_row_basis;
  bool copy_row_dual;
  bool copy_row_value;
  HighsInt i;
  bool copy_col_basis;
  bool copy_col_dual;
  bool copy_col_value;
  HighsInfo *info;
  HighsBasis *basis;
  HighsSolution *solution;
  HighsStatus status;
  Highs highs;
  undefined1 local_5308 [7];
  undefined1 value;
  string *in_stack_ffffffffffffad00;
  Highs *in_stack_ffffffffffffad08;
  undefined1 local_52be;
  bool local_52bd;
  bool local_52bc;
  byte local_52bb;
  bool local_52ba;
  bool local_52b9;
  HighsInt in_stack_ffffffffffffad7c;
  allocator *paVar8;
  HighsInt in_stack_ffffffffffffad88;
  HighsInt in_stack_ffffffffffffad8c;
  uint uVar9;
  undefined4 in_stack_ffffffffffffad90;
  int iVar10;
  undefined1 in_stack_ffffffffffffad94;
  undefined1 in_stack_ffffffffffffad95;
  undefined1 in_stack_ffffffffffffad96;
  undefined1 in_stack_ffffffffffffad97;
  Highs *in_stack_ffffffffffffada0;
  HighsStatus local_5248;
  allocator local_5231;
  double *in_stack_ffffffffffffadd0;
  double *in_stack_ffffffffffffadd8;
  double *in_stack_ffffffffffffade0;
  double *in_stack_ffffffffffffade8;
  _func_int **in_stack_ffffffffffffadf0;
  HighsInt *in_stack_ffffffffffffadf8;
  pointer in_stack_ffffffffffffae00;
  double *in_stack_ffffffffffffae08;
  pointer in_stack_ffffffffffffae10;
  
  value = (undefined1)((ulong)_local_5308 >> 0x38);
  Highs::Highs(in_stack_ffffffffffffada0);
  paVar8 = &local_5231;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffadd0,"output_flag",paVar8);
  Highs::setOptionValue(in_stack_ffffffffffffad08,in_stack_ffffffffffffad00,(bool)value);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffadd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5231);
  *in_stack_00000070 = kMin;
  HVar1 = Highs::passModel((Highs *)CONCAT17(in_stack_ffffffffffffad97,
                                             CONCAT16(in_stack_ffffffffffffad96,
                                                      CONCAT15(in_stack_ffffffffffffad95,
                                                               CONCAT14(in_stack_ffffffffffffad94,
                                                                        in_stack_ffffffffffffad90)))
                                            ),in_stack_ffffffffffffad8c,in_stack_ffffffffffffad88,
                           (HighsInt)((ulong)paVar8 >> 0x20),(HighsInt)paVar8,
                           in_stack_ffffffffffffad7c,(double)local_5308,in_stack_ffffffffffffadd0,
                           in_stack_ffffffffffffadd8,in_stack_ffffffffffffade0,
                           in_stack_ffffffffffffade8,(double *)in_stack_ffffffffffffadf0,
                           in_stack_ffffffffffffadf8,(HighsInt *)in_stack_ffffffffffffae00,
                           in_stack_ffffffffffffae08,(HighsInt *)in_stack_ffffffffffffae10);
  if (HVar1 == kError) {
    local_5248 = kError;
  }
  else {
    local_5248 = Highs::run(in_stack_00000010);
    if (local_5248 == kOk) {
      pHVar2 = Highs::getSolution((Highs *)&stack0xffffffffffffadf0);
      pHVar3 = Highs::getBasis((Highs *)&stack0xffffffffffffadf0);
      pHVar4 = Highs::getModelStatus((Highs *)&stack0xffffffffffffadf0);
      *in_stack_00000070 = *pHVar4;
      pHVar5 = Highs::getInfo((Highs *)&stack0xffffffffffffadf0);
      local_52b9 = false;
      if (in_stack_00000040 != 0) {
        local_52b9 = (pHVar5->super_HighsInfoStruct).primal_solution_status != 0;
      }
      local_52ba = false;
      if (in_stack_00000048 != 0) {
        local_52ba = (pHVar5->super_HighsInfoStruct).dual_solution_status != 0;
      }
      local_52bb = 0;
      if (in_stack_00000060 != 0) {
        local_52bb = pHVar3->valid;
      }
      local_52bb = local_52bb & 1;
      for (iVar10 = 0; iVar10 < in_EDI; iVar10 = iVar10 + 1) {
        if ((local_52b9 & 1U) != 0) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&pHVar2->col_value,(long)iVar10);
          *(value_type *)(in_stack_00000040 + (long)iVar10 * 8) = *pvVar6;
        }
        if ((local_52ba & 1U) != 0) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&pHVar2->col_dual,(long)iVar10);
          *(value_type *)(in_stack_00000048 + (long)iVar10 * 8) = *pvVar6;
        }
        if ((local_52bb & 1) != 0) {
          pvVar7 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                             (&pHVar3->col_status,(long)iVar10);
          *(uint *)(in_stack_00000060 + (long)iVar10 * 4) = (uint)*pvVar7;
        }
      }
      local_52bc = false;
      if (in_stack_00000050 != 0) {
        local_52bc = (pHVar5->super_HighsInfoStruct).primal_solution_status != 0;
      }
      local_52bd = false;
      if (in_stack_00000058 != 0) {
        local_52bd = (pHVar5->super_HighsInfoStruct).dual_solution_status != 0;
      }
      local_52be = 0;
      if (in_stack_00000068 != 0) {
        local_52be = pHVar3->valid;
      }
      uVar9 = (CONCAT21(CONCAT11(local_52bc,local_52bd),local_52be) & 0xffff01) << 8;
      for (iVar10 = 0; iVar10 < in_ESI; iVar10 = iVar10 + 1) {
        if ((uVar9 & 0x1000000) != 0) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&pHVar2->row_value,(long)iVar10);
          *(value_type *)(in_stack_00000050 + (long)iVar10 * 8) = *pvVar6;
        }
        if ((uVar9 & 0x10000) != 0) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&pHVar2->row_dual,(long)iVar10);
          *(value_type *)(in_stack_00000058 + (long)iVar10 * 8) = *pvVar6;
        }
        if ((uVar9 & 0x100) != 0) {
          pvVar7 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                             (&pHVar3->row_status,(long)iVar10);
          *(uint *)(in_stack_00000068 + (long)iVar10 * 4) = (uint)*pvVar7;
        }
      }
    }
  }
  Highs::~Highs(in_stack_00000008);
  return local_5248;
}

Assistant:

HighsInt Highs_lpCall(const HighsInt num_col, const HighsInt num_row,
                      const HighsInt num_nz, const HighsInt a_format,
                      const HighsInt sense, const double offset,
                      const double* col_cost, const double* col_lower,
                      const double* col_upper, const double* row_lower,
                      const double* row_upper, const HighsInt* a_start,
                      const HighsInt* a_index, const double* a_value,
                      double* col_value, double* col_dual, double* row_value,
                      double* row_dual, HighsInt* col_basis_status,
                      HighsInt* row_basis_status, HighsInt* model_status) {
  Highs highs;
  highs.setOptionValue("output_flag", false);
  *model_status = kHighsModelStatusNotset;
  HighsStatus status = highs.passModel(
      num_col, num_row, num_nz, a_format, sense, offset, col_cost, col_lower,
      col_upper, row_lower, row_upper, a_start, a_index, a_value);
  if (status == HighsStatus::kError) return (HighsInt)status;

  status = highs.run();

  if (status == HighsStatus::kOk) {
    const HighsSolution& solution = highs.getSolution();
    const HighsBasis& basis = highs.getBasis();
    *model_status = (HighsInt)highs.getModelStatus();
    const HighsInfo& info = highs.getInfo();

    const bool copy_col_value =
        col_value != nullptr &&
        info.primal_solution_status != SolutionStatus::kSolutionStatusNone;
    const bool copy_col_dual =
        col_dual != nullptr &&
        info.dual_solution_status != SolutionStatus::kSolutionStatusNone;
    const bool copy_col_basis = col_basis_status != nullptr && basis.valid;
    for (HighsInt i = 0; i < num_col; i++) {
      if (copy_col_value) col_value[i] = solution.col_value[i];
      if (copy_col_dual) col_dual[i] = solution.col_dual[i];
      if (copy_col_basis) col_basis_status[i] = (HighsInt)basis.col_status[i];
    }

    const bool copy_row_value =
        row_value != nullptr &&
        info.primal_solution_status != SolutionStatus::kSolutionStatusNone;
    const bool copy_row_dual =
        row_dual != nullptr &&
        info.dual_solution_status != SolutionStatus::kSolutionStatusNone;
    const bool copy_row_basis = row_basis_status != nullptr && basis.valid;
    for (HighsInt i = 0; i < num_row; i++) {
      if (copy_row_value) row_value[i] = solution.row_value[i];
      if (copy_row_dual) row_dual[i] = solution.row_dual[i];
      if (copy_row_basis) row_basis_status[i] = (HighsInt)basis.row_status[i];
    }
  }
  return (HighsInt)status;
}